

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void sort_constraints(TCGOpDef *def,int start,int n)

{
  uint uVar1;
  int *piVar2;
  TCGArgConstraint *pTVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  int iVar28;
  undefined1 auVar22 [16];
  int iVar29;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  auVar26 = _DAT_00d58680;
  if (0 < n) {
    piVar2 = def->sorted_args;
    lVar4 = (long)start;
    lVar9 = (ulong)(uint)n - 1;
    auVar11._8_4_ = (int)lVar9;
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar11 = auVar11 ^ _DAT_00d58680;
    auVar24 = _DAT_00d58660;
    auVar32 = _DAT_00d58670;
    do {
      auVar22 = auVar32 ^ auVar26;
      iVar28 = auVar11._4_4_;
      iVar29 = auVar11._12_4_;
      if ((bool)(~(auVar22._4_4_ == iVar28 && auVar11._0_4_ < auVar22._0_4_ ||
                  iVar28 < auVar22._4_4_) & 1)) {
        *(int *)((long)piVar2 + lVar9 + lVar4 * 4) = start;
      }
      if ((auVar22._12_4_ != iVar29 || auVar22._8_4_ <= auVar11._8_4_) && auVar22._12_4_ <= iVar29)
      {
        *(int *)((long)piVar2 + lVar9 + lVar4 * 4 + 4) = start + 1;
      }
      auVar22 = auVar24 ^ auVar26;
      auVar30._0_4_ = -(uint)(auVar11._0_4_ < auVar22._0_4_);
      auVar30._4_4_ = -(uint)(iVar28 < auVar22._4_4_);
      auVar30._8_4_ = -(uint)(auVar11._8_4_ < auVar22._8_4_);
      auVar30._12_4_ = -(uint)(iVar29 < auVar22._12_4_);
      iVar28 = -(uint)(auVar22._4_4_ == iVar28);
      iVar29 = -(uint)(auVar22._12_4_ == iVar29);
      auVar34._4_4_ = iVar28;
      auVar34._0_4_ = iVar28;
      auVar34._8_4_ = iVar29;
      auVar34._12_4_ = iVar29;
      auVar23._4_4_ = auVar30._4_4_;
      auVar23._0_4_ = auVar30._4_4_;
      auVar23._8_4_ = auVar30._12_4_;
      auVar23._12_4_ = auVar30._12_4_;
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar23 | auVar34 & auVar30) ^ auVar22;
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(int *)((long)piVar2 + lVar9 + lVar4 * 4 + 8) = start + 2;
      }
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(int *)((long)piVar2 + lVar9 + lVar4 * 4 + 0xc) = start + 3;
      }
      auVar23 = _DAT_00d5a450;
      lVar12 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + 4;
      auVar32._8_8_ = lVar12 + 4;
      lVar12 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar12 + 4;
      start = start + 4;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(n + 3U >> 2) << 4 != lVar9);
    if (n != 1) {
      piVar2 = def->sorted_args;
      pTVar3 = def->args_ct;
      uVar6 = 1;
      uVar7 = 0;
      do {
        uVar8 = uVar7 + 1;
        uVar10 = uVar6;
        do {
          iVar28 = piVar2[lVar4 + uVar7];
          iVar29 = 0x20;
          iVar5 = 0x20;
          if ((-1 < (char)pTVar3[iVar28].ct) && (iVar5 = 0, (pTVar3[iVar28].ct & 1) != 0)) {
            uVar1 = pTVar3[iVar28].u.regs;
            iVar13 = 0;
            iVar14 = 0;
            iVar15 = 0;
            iVar16 = 0;
            iVar5 = 0x20;
            auVar26 = auVar23;
            do {
              auVar24 = pshuflw(auVar22,auVar26,0xfe);
              lVar9 = auVar24._0_8_;
              auVar31._0_4_ = uVar1 >> lVar9;
              auVar31._4_4_ = uVar1 >> lVar9;
              auVar31._8_4_ = uVar1 >> lVar9;
              auVar31._12_4_ = uVar1 >> lVar9;
              auVar24 = pshuflw(auVar24,auVar26,0x54);
              iVar17 = auVar26._4_4_;
              iVar19 = auVar26._8_4_;
              iVar20 = auVar26._12_4_;
              auVar25._0_8_ = auVar26._8_8_;
              auVar25._8_4_ = iVar19;
              auVar25._12_4_ = iVar20;
              auVar32 = pshuflw(auVar31,auVar25,0xfe);
              auVar22 = pshuflw(auVar25,auVar25,0x54);
              iVar13 = iVar13 + (uVar1 >> auVar24._0_8_ & 1);
              iVar14 = iVar14 + (auVar31._4_4_ & 1);
              iVar15 = iVar15 + (uVar1 >> auVar22._0_8_ & 1);
              iVar16 = iVar16 + (uVar1 >> auVar32._0_8_ & 1);
              auVar26._0_4_ = auVar26._0_4_ + 4;
              auVar26._4_4_ = iVar17 + 4;
              auVar26._8_4_ = iVar19 + 4;
              auVar26._12_4_ = iVar20 + 4;
              iVar5 = iVar5 + -4;
            } while (iVar5 != 0);
            iVar5 = 0x21 - (iVar16 + iVar14 + iVar15 + iVar13);
          }
          iVar13 = piVar2[lVar4 + uVar10];
          if ((-1 < (char)pTVar3[iVar13].ct) && (iVar29 = 0, (pTVar3[iVar13].ct & 1) != 0)) {
            uVar1 = pTVar3[iVar13].u.regs;
            iVar14 = 0;
            iVar15 = 0;
            iVar16 = 0;
            iVar17 = 0;
            iVar29 = 0x20;
            auVar18 = auVar23;
            do {
              auVar26 = pshuflw(auVar22,auVar18,0xfe);
              lVar9 = auVar26._0_8_;
              auVar33._0_4_ = uVar1 >> lVar9;
              auVar33._4_4_ = uVar1 >> lVar9;
              auVar33._8_4_ = uVar1 >> lVar9;
              auVar33._12_4_ = uVar1 >> lVar9;
              auVar26 = pshuflw(auVar26,auVar18,0x54);
              iVar19 = auVar18._4_4_;
              iVar20 = auVar18._8_4_;
              iVar21 = auVar18._12_4_;
              auVar27._0_8_ = auVar18._8_8_;
              auVar27._8_4_ = iVar20;
              auVar27._12_4_ = iVar21;
              auVar24 = pshuflw(auVar33,auVar27,0xfe);
              auVar22 = pshuflw(auVar27,auVar27,0x54);
              iVar14 = iVar14 + (uVar1 >> auVar26._0_8_ & 1);
              iVar15 = iVar15 + (auVar33._4_4_ & 1);
              iVar16 = iVar16 + (uVar1 >> auVar22._0_8_ & 1);
              iVar17 = iVar17 + (uVar1 >> auVar24._0_8_ & 1);
              auVar18._0_4_ = auVar18._0_4_ + 4;
              auVar18._4_4_ = iVar19 + 4;
              auVar18._8_4_ = iVar20 + 4;
              auVar18._12_4_ = iVar21 + 4;
              iVar29 = iVar29 + -4;
            } while (iVar29 != 0);
            iVar29 = 0x21 - (iVar17 + iVar15 + iVar16 + iVar14);
          }
          if (iVar5 < iVar29) {
            piVar2[lVar4 + uVar7] = iVar13;
            piVar2[lVar4 + uVar10] = iVar28;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)n);
        uVar6 = uVar6 + 1;
        uVar7 = uVar8;
      } while (uVar8 != n - 1);
    }
  }
  return;
}

Assistant:

static void sort_constraints(TCGOpDef *def, int start, int n)
{
    int i, j, p1, p2, tmp;

    for(i = 0; i < n; i++)
        def->sorted_args[start + i] = start + i;
    if (n <= 1)
        return;
    for(i = 0; i < n - 1; i++) {
        for(j = i + 1; j < n; j++) {
            p1 = get_constraint_priority(def, def->sorted_args[start + i]);
            p2 = get_constraint_priority(def, def->sorted_args[start + j]);
            if (p1 < p2) {
                tmp = def->sorted_args[start + i];
                def->sorted_args[start + i] = def->sorted_args[start + j];
                def->sorted_args[start + j] = tmp;
            }
        }
    }
}